

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O0

int envy_bios_parse_power_unk48(envy_bios *bios)

{
  int iVar1;
  int iVar2;
  int iVar3;
  envy_bios_power_unk48 *peVar4;
  envy_bios_power_unk48_entry *peVar5;
  uint32_t data;
  int err;
  int i;
  envy_bios_power_unk48 *unk48;
  envy_bios *bios_local;
  
  peVar4 = &(bios->power).unk48;
  if (peVar4->offset == 0) {
    bios_local._4_4_ = -0x16;
  }
  else {
    bios_u8(bios,peVar4->offset,&(bios->power).unk48.version);
    if ((bios->power).unk48.version == '\x10') {
      iVar1 = bios_u8(bios,peVar4->offset + 1,&(bios->power).unk48.hlen);
      iVar2 = bios_u8(bios,peVar4->offset + 2,&(bios->power).unk48.rlen);
      iVar3 = bios_u8(bios,peVar4->offset + 3,&(bios->power).unk48.entriesnum);
      (bios->power).unk48.valid = ((iVar3 != 0 || (iVar2 != 0 || iVar1 != 0)) ^ 0xffU) & 1;
      peVar5 = (envy_bios_power_unk48_entry *)malloc((ulong)(bios->power).unk48.entriesnum << 2);
      (bios->power).unk48.entries = peVar5;
      for (data = 0; (int)data < (int)(uint)(bios->power).unk48.entriesnum; data = data + 1) {
        (bios->power).unk48.entries[(int)data].offset =
             peVar4->offset + (uint)(bios->power).unk48.hlen + data * (bios->power).unk48.rlen;
      }
      bios_local._4_4_ = 0;
    }
    else {
      fprintf(_stderr,"Unknown THERMAL CHANNEL table version 0x%x\n",
              (ulong)(bios->power).unk48.version);
      bios_local._4_4_ = -0x16;
    }
  }
  return bios_local._4_4_;
}

Assistant:

int envy_bios_parse_power_unk48(struct envy_bios *bios) {
	struct envy_bios_power_unk48 *unk48 = &bios->power.unk48;
	int i, err = 0;

	if (!unk48->offset)
		return -EINVAL;

	bios_u8(bios, unk48->offset + 0x0, &unk48->version);
	switch(unk48->version) {
	case 0x10:
		err |= bios_u8(bios, unk48->offset + 0x1, &unk48->hlen);
		err |= bios_u8(bios, unk48->offset + 0x2, &unk48->rlen);
		err |= bios_u8(bios, unk48->offset + 0x3, &unk48->entriesnum);
		unk48->valid = !err;
		break;
	default:
		ENVY_BIOS_ERR("Unknown THERMAL CHANNEL table version 0x%x\n", unk48->version);
		return -EINVAL;
	};

	err = 0;
	unk48->entries = malloc(unk48->entriesnum * sizeof(struct envy_bios_power_unk48_entry));
	for (i = 0; i < unk48->entriesnum; i++) {
		uint32_t data = unk48->offset + unk48->hlen + i * unk48->rlen;

		unk48->entries[i].offset = data;
	}

	return 0;
}